

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

uint64_t uv__get_cgroup_constrained_memory(char *buf)

{
  char *pcVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  long lVar4;
  size_t sVar5;
  uint64_t uVar6;
  uint local_103c;
  char filename [4097];
  
  if (*(int *)buf == 0x2f3a3a30) {
    pcVar1 = buf + 4;
    sVar5 = strcspn(pcVar1,"\n");
    snprintf(filename,0x1001,"/sys/fs/cgroup/%.*s/memory.max",sVar5 & 0xffffffff,pcVar1);
    uVar3 = uv__read_uint64(filename);
    snprintf(filename,0x1001,"/sys/fs/cgroup/%.*s/memory.high",sVar5 & 0xffffffff,pcVar1);
    uVar2 = uv__read_uint64(filename);
    goto LAB_0011c369;
  }
  pcVar1 = uv__cgroup1_find_memory_controller(buf,(int *)&local_103c);
  if (pcVar1 == (char *)0x0) {
LAB_0011c2bf:
    uVar2 = uv__read_uint64("/sys/fs/cgroup/memory/memory.soft_limit_in_bytes");
    uVar3 = uv__read_uint64("/sys/fs/cgroup/memory/memory.limit_in_bytes");
  }
  else {
    snprintf(filename,0x1001,"/sys/fs/cgroup/memory/%.*s/memory.soft_limit_in_bytes",
             (ulong)local_103c,pcVar1);
    uVar2 = uv__read_uint64(filename);
    snprintf(filename,0x1001,"/sys/fs/cgroup/memory/%.*s/memory.limit_in_bytes",(ulong)local_103c,
             pcVar1);
    uVar3 = uv__read_uint64(filename);
    if (uVar3 == 0 || uVar2 == 0) goto LAB_0011c2bf;
  }
  lVar4 = sysconf(0x1e);
  if (uVar2 == (-lVar4 & 0x7fffffffffffffffU)) {
    uVar2 = 0xffffffffffffffff;
  }
  if (uVar3 == (-lVar4 & 0x7fffffffffffffffU)) {
    uVar3 = 0xffffffffffffffff;
  }
LAB_0011c369:
  uVar6 = uVar3;
  if (uVar2 < uVar3) {
    uVar6 = uVar2;
  }
  if (uVar3 == 0) {
    uVar6 = uVar3;
  }
  if (uVar2 == 0) {
    uVar6 = uVar2;
  }
  return uVar6;
}

Assistant:

static uint64_t uv__get_cgroup_constrained_memory(char buf[static 1024]) {
  uint64_t high;
  uint64_t max;

  /* In the case of cgroupv2, we'll only have a single entry. */
  if (strncmp(buf, "0::/", 4))
    uv__get_cgroup1_memory_limits(buf, &high, &max);
  else
    uv__get_cgroup2_memory_limits(buf, &high, &max);

  if (high == 0 || max == 0)
    return 0;

  return high < max ? high : max;
}